

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O0

CURLcode tftp_tx(tftp_state_data_t *state,tftp_event_t event)

{
  Curl_easy *pCVar1;
  connectdata *pcVar2;
  ssize_t sVar3;
  CURLcode CVar4;
  unsigned_short uVar5;
  int *piVar6;
  char *pcVar7;
  bool local_61;
  int local_44;
  SingleRequest *pSStack_40;
  int cb;
  SingleRequest *k;
  CURLcode result;
  int rblock;
  ssize_t sbytes;
  Curl_easy *data;
  tftp_state_data_t *ptStack_18;
  tftp_event_t event_local;
  tftp_state_data_t *state_local;
  
  sbytes = (ssize_t)state->conn->data;
  k._0_4_ = CURLE_OK;
  pSStack_40 = &((Curl_easy *)sbytes)->req;
  data._4_4_ = event;
  ptStack_18 = state;
  switch(event) {
  case TFTP_EVENT_ACK:
  case TFTP_EVENT_OACK:
    if (event == TFTP_EVENT_ACK) {
      uVar5 = getrpacketblock(&state->rpacket);
      k._4_4_ = (uint)uVar5;
      if ((k._4_4_ != ptStack_18->block) && ((ptStack_18->block != 0 || (k._4_4_ != 0xffff)))) {
        Curl_infof((Curl_easy *)sbytes,"Received ACK for block %d, expecting %d\n",(ulong)k._4_4_,
                   (ulong)ptStack_18->block);
        ptStack_18->retries = ptStack_18->retries + 1;
        if (ptStack_18->retry_max < ptStack_18->retries) {
          Curl_failf((Curl_easy *)sbytes,"tftp_tx: giving up waiting for block %d ack",
                     (ulong)ptStack_18->block);
          k._0_4_ = CURLE_SEND_ERROR;
        }
        else {
          _result = sendto(ptStack_18->sockfd,(ptStack_18->spacket).data,
                           (long)(ptStack_18->sbytes + 4),0x4000,
                           (sockaddr *)&ptStack_18->remote_addr,ptStack_18->remote_addrlen);
          sVar3 = sbytes;
          if (_result < 0) {
            pcVar2 = ptStack_18->conn;
            piVar6 = __errno_location();
            pcVar7 = Curl_strerror(pcVar2,*piVar6);
            Curl_failf((Curl_easy *)sVar3,"%s",pcVar7);
            k._0_4_ = CURLE_SEND_ERROR;
          }
        }
        return (CURLcode)k;
      }
      time(&ptStack_18->rx_time);
      ptStack_18->block = ptStack_18->block + 1;
    }
    else {
      state->block = 1;
    }
    ptStack_18->retries = 0;
    setpacketevent(&ptStack_18->spacket,3);
    setpacketblock(&ptStack_18->spacket,ptStack_18->block);
    if ((1 < ptStack_18->block) && (ptStack_18->sbytes < ptStack_18->blksize)) {
      ptStack_18->state = TFTP_STATE_FIN;
      return CURLE_OK;
    }
    ptStack_18->sbytes = 0;
    (ptStack_18->conn->data->req).upload_fromhere = (char *)((ptStack_18->spacket).data + 4);
    CVar4 = (CURLcode)k;
    do {
      k._0_4_ = CVar4;
      k._0_4_ = Curl_fillreadbuffer(ptStack_18->conn,ptStack_18->blksize - ptStack_18->sbytes,
                                    &local_44);
      if ((CURLcode)k != CURLE_OK) {
        return (CURLcode)k;
      }
      ptStack_18->sbytes = local_44 + ptStack_18->sbytes;
      pCVar1 = ptStack_18->conn->data;
      (pCVar1->req).upload_fromhere = (pCVar1->req).upload_fromhere + local_44;
      local_61 = ptStack_18->sbytes < ptStack_18->blksize && local_44 != 0;
      CVar4 = CURLE_OK;
    } while (local_61);
    _result = sendto(ptStack_18->sockfd,(ptStack_18->spacket).data,(long)(ptStack_18->sbytes + 4),
                     0x4000,(sockaddr *)&ptStack_18->remote_addr,ptStack_18->remote_addrlen);
    sVar3 = sbytes;
    if (_result < 0) {
      pcVar2 = ptStack_18->conn;
      piVar6 = __errno_location();
      pcVar7 = Curl_strerror(pcVar2,*piVar6);
      Curl_failf((Curl_easy *)sVar3,"%s",pcVar7);
      return CURLE_SEND_ERROR;
    }
    pSStack_40->writebytecount = (long)ptStack_18->sbytes + pSStack_40->writebytecount;
    Curl_pgrsSetUploadCounter((Curl_easy *)sbytes,pSStack_40->writebytecount);
    break;
  case TFTP_EVENT_ERROR:
    state->state = TFTP_STATE_FIN;
    setpacketevent(&state->spacket,5);
    setpacketblock(&ptStack_18->spacket,ptStack_18->block);
    sendto(ptStack_18->sockfd,(ptStack_18->spacket).data,4,0x4000,
           (sockaddr *)&ptStack_18->remote_addr,ptStack_18->remote_addrlen);
    ptStack_18->state = TFTP_STATE_FIN;
    break;
  case TFTP_EVENT_TIMEOUT:
    state->retries = state->retries + 1;
    Curl_infof((Curl_easy *)sbytes,"Timeout waiting for block %d ACK.  Retries = %d\n",
               (ulong)(state->block + 1 & 0xffff),(ulong)(uint)state->retries);
    if (ptStack_18->retry_max < ptStack_18->retries) {
      ptStack_18->error = TFTP_ERR_TIMEOUT;
      ptStack_18->state = TFTP_STATE_FIN;
    }
    else {
      _result = sendto(ptStack_18->sockfd,(ptStack_18->spacket).data,(long)(ptStack_18->sbytes + 4),
                       0x4000,(sockaddr *)&ptStack_18->remote_addr,ptStack_18->remote_addrlen);
      sVar3 = sbytes;
      if (_result < 0) {
        pcVar2 = ptStack_18->conn;
        piVar6 = __errno_location();
        pcVar7 = Curl_strerror(pcVar2,*piVar6);
        Curl_failf((Curl_easy *)sVar3,"%s",pcVar7);
        return CURLE_SEND_ERROR;
      }
      Curl_pgrsSetUploadCounter((Curl_easy *)sbytes,pSStack_40->writebytecount);
    }
    break;
  default:
    Curl_failf((Curl_easy *)sbytes,"tftp_tx: internal error, event: %i",(ulong)(uint)event);
  }
  return (CURLcode)k;
}

Assistant:

static CURLcode tftp_tx(tftp_state_data_t *state, tftp_event_t event)
{
  struct Curl_easy *data = state->conn->data;
  ssize_t sbytes;
  int rblock;
  CURLcode result = CURLE_OK;
  struct SingleRequest *k = &data->req;
  int cb; /* Bytes currently read */

  switch(event) {

  case TFTP_EVENT_ACK:
  case TFTP_EVENT_OACK:
    if(event == TFTP_EVENT_ACK) {
      /* Ack the packet */
      rblock = getrpacketblock(&state->rpacket);

      if(rblock != state->block &&
         /* There's a bug in tftpd-hpa that causes it to send us an ack for
          * 65535 when the block number wraps to 0. So when we're expecting
          * 0, also accept 65535. See
          * http://syslinux.zytor.com/archives/2010-September/015253.html
          * */
         !(state->block == 0 && rblock == 65535)) {
        /* This isn't the expected block.  Log it and up the retry counter */
        infof(data, "Received ACK for block %d, expecting %d\n",
              rblock, state->block);
        state->retries++;
        /* Bail out if over the maximum */
        if(state->retries>state->retry_max) {
          failf(data, "tftp_tx: giving up waiting for block %d ack",
                state->block);
          result = CURLE_SEND_ERROR;
        }
        else {
          /* Re-send the data packet */
          sbytes = sendto(state->sockfd, (void *)state->spacket.data,
                          4 + state->sbytes, SEND_4TH_ARG,
                          (struct sockaddr *)&state->remote_addr,
                          state->remote_addrlen);
          /* Check all sbytes were sent */
          if(sbytes<0) {
            failf(data, "%s", Curl_strerror(state->conn, SOCKERRNO));
            result = CURLE_SEND_ERROR;
          }
        }

        return result;
      }
      /* This is the expected packet.  Reset the counters and send the next
         block */
      time(&state->rx_time);
      state->block++;
    }
    else
      state->block = 1; /* first data block is 1 when using OACK */

    state->retries = 0;
    setpacketevent(&state->spacket, TFTP_EVENT_DATA);
    setpacketblock(&state->spacket, state->block);
    if(state->block > 1 && state->sbytes < (int)state->blksize) {
      state->state = TFTP_STATE_FIN;
      return CURLE_OK;
    }

    /* TFTP considers data block size < 512 bytes as an end of session. So
     * in some cases we must wait for additional data to build full (512 bytes)
     * data block.
     * */
    state->sbytes = 0;
    state->conn->data->req.upload_fromhere = (char *)state->spacket.data + 4;
    do {
      result = Curl_fillreadbuffer(state->conn, state->blksize - state->sbytes,
                                   &cb);
      if(result)
        return result;
      state->sbytes += cb;
      state->conn->data->req.upload_fromhere += cb;
    } while(state->sbytes < state->blksize && cb != 0);

    sbytes = sendto(state->sockfd, (void *) state->spacket.data,
                    4 + state->sbytes, SEND_4TH_ARG,
                    (struct sockaddr *)&state->remote_addr,
                    state->remote_addrlen);
    /* Check all sbytes were sent */
    if(sbytes<0) {
      failf(data, "%s", Curl_strerror(state->conn, SOCKERRNO));
      return CURLE_SEND_ERROR;
    }
    /* Update the progress meter */
    k->writebytecount += state->sbytes;
    Curl_pgrsSetUploadCounter(data, k->writebytecount);
    break;

  case TFTP_EVENT_TIMEOUT:
    /* Increment the retry counter and log the timeout */
    state->retries++;
    infof(data, "Timeout waiting for block %d ACK. "
          " Retries = %d\n", NEXT_BLOCKNUM(state->block), state->retries);
    /* Decide if we've had enough */
    if(state->retries > state->retry_max) {
      state->error = TFTP_ERR_TIMEOUT;
      state->state = TFTP_STATE_FIN;
    }
    else {
      /* Re-send the data packet */
      sbytes = sendto(state->sockfd, (void *)state->spacket.data,
                      4 + state->sbytes, SEND_4TH_ARG,
                      (struct sockaddr *)&state->remote_addr,
                      state->remote_addrlen);
      /* Check all sbytes were sent */
      if(sbytes<0) {
        failf(data, "%s", Curl_strerror(state->conn, SOCKERRNO));
        return CURLE_SEND_ERROR;
      }
      /* since this was a re-send, we remain at the still byte position */
      Curl_pgrsSetUploadCounter(data, k->writebytecount);
    }
    break;

  case TFTP_EVENT_ERROR:
    state->state = TFTP_STATE_FIN;
    setpacketevent(&state->spacket, TFTP_EVENT_ERROR);
    setpacketblock(&state->spacket, state->block);
    (void)sendto(state->sockfd, (void *)state->spacket.data, 4, SEND_4TH_ARG,
                 (struct sockaddr *)&state->remote_addr,
                 state->remote_addrlen);
    /* don't bother with the return code, but if the socket is still up we
     * should be a good TFTP client and let the server know we're done */
    state->state = TFTP_STATE_FIN;
    break;

  default:
    failf(data, "tftp_tx: internal error, event: %i", (int)(event));
    break;
  }

  return result;
}